

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQMDP.cpp
# Opt level: O0

void __thiscall
FactoredQLastTimeStepOrQMDP::FactoredQLastTimeStepOrQMDP
          (FactoredQLastTimeStepOrQMDP *this,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  QFunctionForDecPOMDPInterface QVar1;
  QMDP *in_RSI;
  QFunctionForDecPOMDPInterface *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffffe8;
  
  QFunctionInterface::QFunctionInterface((QFunctionInterface *)in_RDI);
  QFunctionForDecPOMDPInterface::QFunctionForDecPOMDPInterface(in_RDI,&PTR_PTR_00d07e80);
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)(in_RDI + 1),
             &PTR_construction_vtable_152__00d07e90);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            ((FactoredQLastTimeStepOrElse *)in_RSI,(void **)in_stack_ffffffffffffffe8,
             (PlanningUnitFactoredDecPOMDPDiscrete *)
             CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  *in_RDI = (QFunctionForDecPOMDPInterface)0xd07c18;
  *in_RDI = (QFunctionForDecPOMDPInterface)0xd07c18;
  *in_RDI = (QFunctionForDecPOMDPInterface)0xd07c18;
  in_RDI[1] = (QFunctionForDecPOMDPInterface)0xd07d60;
  in_RDI[1] = (QFunctionForDecPOMDPInterface)0xd07d60;
  QVar1 = (QFunctionForDecPOMDPInterface)operator_new(0x70);
  QMDP::QMDP(in_RSI,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
  in_RDI[0xb] = QVar1;
  return;
}

Assistant:

FactoredQLastTimeStepOrQMDP::
FactoredQLastTimeStepOrQMDP(const PlanningUnitFactoredDecPOMDPDiscrete* puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QMDP=new QMDP( puf );
}